

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::InitValueVisitor::~InitValueVisitor(InitValueVisitor *this)

{
  InitValueVisitor *this_local;
  
  ~InitValueVisitor(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

[[maybe_unused]] explicit InitValueVisitor(std::function<void(AssignStmt *)> fn)
        : fn_(std::move(fn)) {}